

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTArray.hpp
# Opt level: O0

void __thiscall antlr::ASTArray::~ASTArray(ASTArray *this)

{
  vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
  *in_stack_00000010;
  
  std::vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>::
  ~vector(in_stack_00000010);
  return;
}

Assistant:

class ANTLR_API ASTArray {
public:
	int size; // = 0;
	ANTLR_USE_NAMESPACE(std)vector<RefAST> array;

	ASTArray(int capacity)
	: size(0)
	, array(capacity)
	{
	}

	ASTArray* add(RefAST node)
	{
		array[size++] = node;
		return this;
	}
}